

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CsrPoslist(Fts5Cursor *pCsr,int iPhrase,u8 **pa,int *pn)

{
  Fts5Config *pConfig;
  Fts5Expr *pFVar1;
  Fts5Sorter *pFVar2;
  Fts5ExprPhrase **ppFVar3;
  long *plVar4;
  Fts5Colset *pFVar5;
  Fts5ExprPhrase *pFVar6;
  int iVar7;
  int iVar8;
  Fts5Sorter *pSorter;
  void *__s;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  int n;
  char *z;
  int local_64;
  char *local_60;
  Fts5Expr *local_58;
  void *pvStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pConfig = (Fts5Config *)(pCsr->base).pVtab[1].pModule;
  iVar8 = 0x19;
  if (-1 < iPhrase) {
    pFVar1 = pCsr->pExpr;
    if (pFVar1 == (Fts5Expr *)0x0) {
      iVar7 = 0;
    }
    else {
      iVar7 = pFVar1->nPhrase;
    }
    if (iPhrase < iVar7) {
      pFVar2 = pCsr->pSorter;
      if ((pConfig->eDetail != 0) && ((pConfig->eContent & 0xfffffffdU) == 1)) {
        *pa = (u8 *)0x0;
        *pn = 0;
        iVar8 = 0;
        goto LAB_001eea59;
      }
      iVar8 = 0;
      if ((pCsr->csrflags & 0x40) != 0) {
        if (pConfig->eDetail == 0) {
          iVar8 = 0;
        }
        else {
          iVar8 = pFVar1->nPhrase;
          iVar7 = sqlite3_initialize();
          if (iVar7 == 0) {
            __s = sqlite3Malloc((long)iVar8 << 4);
          }
          else {
            __s = (void *)0x0;
          }
          if (__s == (void *)0x0) {
            iVar8 = 7;
          }
          else {
            iVar8 = 0;
            memset(__s,0,(long)pFVar1->nPhrase << 4);
            iVar7 = pFVar1->nPhrase;
            if (0 < (long)iVar7) {
              ppFVar3 = pFVar1->apExprPhrase;
              lVar9 = 0;
              do {
                plVar4 = *(long **)((long)ppFVar3 + lVar9);
                if ((pFVar2 == (Fts5Sorter *)0x0) &&
                   ((((int)plVar4[2] == 0 || (*(long *)(*plVar4 + 0x18) != pFVar1->pRoot->iRowid))
                    || (*(int *)(*plVar4 + 4) != 0)))) {
                  *(undefined4 *)((long)__s + lVar9 * 2 + 0xc) = 1;
                }
                else {
                  *(undefined4 *)(plVar4 + 2) = 0;
                }
                lVar9 = lVar9 + 8;
              } while ((long)iVar7 * 8 != lVar9);
              iVar8 = 0;
            }
          }
          if (__s != (void *)0x0) {
            iVar8 = fts5SeekCursor(pCsr,0);
          }
          if (iVar8 == 0 && 0 < pConfig->nCol) {
            uVar11 = 0;
            do {
              local_60 = (char *)0x0;
              local_64 = 0;
              iVar8 = fts5TextFromStmt(pConfig,pCsr->pStmt,(int)uVar11,&local_60,&local_64);
              if (iVar8 == 0) {
                local_58 = pCsr->pExpr;
                local_48 = (uVar11 << 0x20) + -1;
                iVar8 = local_58->nPhrase;
                if (0 < (long)iVar8) {
                  ppFVar3 = local_58->apExprPhrase;
                  lVar9 = 0;
                  do {
                    pFVar5 = ppFVar3[lVar9]->pNode->pNear->pColset;
                    if (pFVar5 == (Fts5Colset *)0x0) {
LAB_001ee922:
                      if (*(int *)((long)__s + lVar9 * 0x10 + 0xc) != 0) goto LAB_001ee931;
                      *(undefined4 *)((long)__s + lVar9 * 0x10 + 8) = 1;
                    }
                    else {
                      if (0 < (long)pFVar5->nCol) {
                        lVar10 = 0;
                        do {
                          if (uVar11 == (uint)pFVar5->aiCol[lVar10]) goto LAB_001ee922;
                          lVar10 = lVar10 + 1;
                        } while (pFVar5->nCol != lVar10);
                      }
LAB_001ee931:
                      *(undefined4 *)((long)__s + lVar9 * 0x10 + 8) = 0;
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != iVar8);
                }
                pvStack_50 = __s;
                iVar8 = sqlite3Fts5Tokenize(pConfig,4,local_60,local_64,&local_58,
                                            fts5ExprPopulatePoslistsCb);
              }
              (pConfig->t).pLocale = (char *)0x0;
              (pConfig->t).nLocale = 0;
              uVar11 = uVar11 + 1;
            } while (((long)uVar11 < (long)pConfig->nCol) && (iVar8 == 0));
          }
          sqlite3_free(__s);
          if (pCsr->pSorter != (Fts5Sorter *)0x0) {
            fts5ExprCheckPoslists(pCsr->pExpr->pRoot,pCsr->pSorter->iRowid);
          }
        }
        *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xbf;
      }
    }
  }
  if (iVar8 == 0) {
    pFVar2 = pCsr->pSorter;
    if ((pFVar2 == (Fts5Sorter *)0x0) || (pConfig->eDetail != 0)) {
      pFVar6 = pCsr->pExpr->apExprPhrase[iPhrase];
      if ((pFVar6->pNode->bEof == 0) && (pFVar6->pNode->iRowid == pCsr->pExpr->pRoot->iRowid)) {
        *pa = (pFVar6->poslist).p;
        iVar7 = (pFVar6->poslist).n;
      }
      else {
        *pa = (u8 *)0x0;
        iVar7 = 0;
      }
      *pn = iVar7;
    }
    else {
      if (iPhrase == 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = pFVar2->aIdx[(long)iPhrase + -1];
      }
      *pn = pFVar2->aIdx[iPhrase] - iVar7;
      *pa = pFVar2->aPoslist + iVar7;
    }
  }
  else {
    *pa = (u8 *)0x0;
    *pn = 0;
  }
LAB_001eea59:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

static int fts5CsrPoslist(
  Fts5Cursor *pCsr,               /* Fts5 cursor object */
  int iPhrase,                    /* Phrase to find position list for */
  const u8 **pa,                  /* OUT: Pointer to position list buffer */
  int *pn                         /* OUT: Size of (*pa) in bytes */
){
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;
  int rc = SQLITE_OK;
  int bLive = (pCsr->pSorter==0);

  if( iPhrase<0 || iPhrase>=sqlite3Fts5ExprPhraseCount(pCsr->pExpr) ){
    rc = SQLITE_RANGE;
  }else if( pConfig->eDetail!=FTS5_DETAIL_FULL
         && fts5IsContentless((Fts5FullTable*)pCsr->base.pVtab, 1)
  ){
    *pa = 0;
    *pn = 0;
    return SQLITE_OK;
  }else if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_POSLIST) ){
    if( pConfig->eDetail!=FTS5_DETAIL_FULL ){
      Fts5PoslistPopulator *aPopulator;
      int i;

      aPopulator = sqlite3Fts5ExprClearPoslists(pCsr->pExpr, bLive);
      if( aPopulator==0 ) rc = SQLITE_NOMEM;
      if( rc==SQLITE_OK ){
        rc = fts5SeekCursor(pCsr, 0);
      }
      for(i=0; i<pConfig->nCol && rc==SQLITE_OK; i++){
        const char *z = 0;
        int n = 0;
        rc = fts5TextFromStmt(pConfig, pCsr->pStmt, i, &z, &n);
        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5ExprPopulatePoslists(
              pConfig, pCsr->pExpr, aPopulator, i, z, n
          );
        }
        sqlite3Fts5ClearLocale(pConfig);
      }
      sqlite3_free(aPopulator);

      if( pCsr->pSorter ){
        sqlite3Fts5ExprCheckPoslists(pCsr->pExpr, pCsr->pSorter->iRowid);
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_POSLIST);
  }

  if( rc==SQLITE_OK ){
    if( pCsr->pSorter && pConfig->eDetail==FTS5_DETAIL_FULL ){
      Fts5Sorter *pSorter = pCsr->pSorter;
      int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
      *pn = pSorter->aIdx[iPhrase] - i1;
      *pa = &pSorter->aPoslist[i1];
    }else{
      *pn = sqlite3Fts5ExprPoslist(pCsr->pExpr, iPhrase, pa);
    }
  }else{
    *pa = 0;
    *pn = 0;
  }

  return rc;
}